

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

_Bool str_starts_with_any(char *haystack,char **needles,int num_needles)

{
  _Bool _Var1;
  int local_28;
  int i;
  int num_needles_local;
  char **needles_local;
  char *haystack_local;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x251,"_Bool str_starts_with_any(const char *, const char **, int)");
  }
  if (needles != (char **)0x0) {
    if (num_needles < 0) {
      __assert_fail("num_needles >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                    ,0x253,"_Bool str_starts_with_any(const char *, const char **, int)");
    }
    local_28 = 0;
    while( true ) {
      if (num_needles <= local_28) {
        return false;
      }
      if (needles[local_28] == (char *)0x0) break;
      _Var1 = str_starts_with(haystack,needles[local_28]);
      if (_Var1) {
        return true;
      }
      local_28 = local_28 + 1;
    }
    __assert_fail("needles[i] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x256,"_Bool str_starts_with_any(const char *, const char **, int)");
  }
  __assert_fail("needles != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x252,"_Bool str_starts_with_any(const char *, const char **, int)");
}

Assistant:

bool str_starts_with_any(const char *haystack, const char **needles, int num_needles)
{
    assert(haystack != NULL);
    assert(needles != NULL);
    assert(num_needles >= 0);

    for (int i = 0; i < num_needles; i++) {
        assert(needles[i] != NULL);
        if (str_starts_with(haystack, needles[i]))
            return true;
    }

    return false;
}